

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O2

void Assimp::FBX::ParseVectorDataArray(vector<float,_std::allocator<float>_> *out,Element *el)

{
  Token *t;
  pointer ppTVar1;
  char *end;
  size_t __n;
  Scope *sc;
  Element *pEVar2;
  Element *in_R9;
  pointer ppTVar3;
  long lVar4;
  _Alloc_hider _Var5;
  float fVar6;
  char type;
  vector<char,_std::allocator<char>_> buff;
  char *data;
  uint32_t count;
  byte local_6d;
  float local_6c;
  string local_68;
  char *local_40;
  uint32_t local_34;
  
  std::vector<float,_std::allocator<float>_>::resize(out,0);
  ppTVar3 = (el->tokens).
            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar3 ==
      (el->tokens).
      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string
              ((string *)&local_68,"unexpected empty element",(allocator *)&local_40);
    anon_unknown.dwarf_1e32c8::ParseError(&local_68,el);
  }
  t = *ppTVar3;
  if (t->column == 0xffffffff) {
    local_40 = t->sbegin;
    end = t->send;
    anon_unknown_20::ReadBinaryDataArrayHead(&local_40,end,(char *)&local_6d,&local_34,el);
    if (local_34 != 0) {
      if ((local_6d & 0xfd) != 100) {
        std::__cxx11::string::string
                  ((string *)&local_68,"expected float or double array (binary)",
                   (allocator *)&local_6c);
        anon_unknown.dwarf_1e32c8::ParseError(&local_68,el);
      }
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity = 0;
      anon_unknown_20::ReadBinaryDataArray
                (local_6d,local_34,&local_40,end,(vector<char,_std::allocator<char>_> *)&local_68,
                 in_R9);
      _Var5._M_p = local_68._M_dataplus._M_p;
      if (local_6d == 0x66) {
        while (local_34 != 0) {
          std::vector<float,_std::allocator<float>_>::push_back
                    (out,(value_type_conflict4 *)_Var5._M_p);
          _Var5._M_p = (pointer)((long)_Var5._M_p + 4);
          local_34 = local_34 - 1;
        }
      }
      else if (local_6d == 100) {
        for (lVar4 = 0; local_34 != (uint32_t)lVar4; lVar4 = lVar4 + 1) {
          local_6c = (float)*(double *)(_Var5._M_p + lVar4 * 8);
          std::vector<float,_std::allocator<float>_>::emplace_back<float>(out,&local_6c);
        }
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&local_68);
    }
  }
  else {
    __n = ParseTokenAsDim(t);
    std::vector<float,_std::allocator<float>_>::reserve(out,__n);
    sc = GetRequiredScope(el);
    std::__cxx11::string::string((string *)&local_68,"a",(allocator *)&local_40);
    pEVar2 = GetRequiredElement(sc,&local_68,el);
    std::__cxx11::string::~string((string *)&local_68);
    ppTVar1 = (pEVar2->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar3 = (pEVar2->tokens).
                   super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppTVar3 != ppTVar1;
        ppTVar3 = ppTVar3 + 1) {
      fVar6 = ParseTokenAsFloat(*ppTVar3);
      local_68._M_dataplus._M_p._0_4_ = fVar6;
      std::vector<float,_std::allocator<float>_>::push_back(out,(value_type_conflict4 *)&local_68);
    }
  }
  return;
}

Assistant:

void ParseVectorDataArray(std::vector<float>& out, const Element& el)
{
    out.resize( 0 );
    const TokenList& tok = el.Tokens();
    if(tok.empty()) {
        ParseError("unexpected empty element",&el);
    }

    if(tok[0]->IsBinary()) {
        const char* data = tok[0]->begin(), *end = tok[0]->end();

        char type;
        uint32_t count;
        ReadBinaryDataArrayHead(data, end, type, count, el);

        if(!count) {
            return;
        }

        if (type != 'd' && type != 'f') {
            ParseError("expected float or double array (binary)",&el);
        }

        std::vector<char> buff;
        ReadBinaryDataArray(type, count, data, end, buff, el);

        ai_assert(data == end);
        ai_assert(buff.size() == count * (type == 'd' ? 8 : 4));

        if (type == 'd') {
            const double* d = reinterpret_cast<const double*>(&buff[0]);
            for (unsigned int i = 0; i < count; ++i, ++d) {
                out.push_back(static_cast<float>(*d));
            }
        }
        else if (type == 'f') {
            const float* f = reinterpret_cast<const float*>(&buff[0]);
            for (unsigned int i = 0; i < count; ++i, ++f) {
                out.push_back(*f);
            }
        }

        return;
    }

    const size_t dim = ParseTokenAsDim(*tok[0]);

    // see notes in ParseVectorDataArray()
    out.reserve(dim);

    const Scope& scope = GetRequiredScope(el);
    const Element& a = GetRequiredElement(scope,"a",&el);

    for (TokenList::const_iterator it = a.Tokens().begin(), end = a.Tokens().end(); it != end; ) {
        const float ival = ParseTokenAsFloat(**it++);
        out.push_back(ival);
    }
}